

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::BeginGlobal
          (BinaryReaderObjdump *this,Index index,Type type,bool mutable_)

{
  char *pcVar1;
  undefined7 in_register_00000009;
  string_view sVar2;
  Type local_1c;
  
  local_1c.enum_ = type.enum_;
  pcVar1 = Type::GetName(&local_1c);
  PrintDetails(this," - global[%u] %s mutable=%d",(ulong)index,pcVar1,
               CONCAT71(in_register_00000009,mutable_) & 0xffffffff);
  sVar2 = BinaryReaderObjdumpBase::GetGlobalName(&this->super_BinaryReaderObjdumpBase,index);
  if (sVar2.size_ != 0) {
    PrintDetails(this," <%.*s>",sVar2.size_,sVar2.data_);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginGlobal(Index index, Type type, bool mutable_) {
  PrintDetails(" - global[%" PRIindex "] %s mutable=%d", index, type.GetName(),
               mutable_);
  string_view name = GetGlobalName(index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  return Result::Ok;
}